

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

ostream * operator<<(ostream *out,ShapeRange *shape)

{
  RangeValue local_30;
  RangeValue local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  local_20._isUnbound = (shape->_minimum)._isUnbound;
  local_20._val = (shape->_minimum)._val;
  operator<<(out,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  local_30._isUnbound = (shape->_maximum)._isUnbound;
  local_30._val = (shape->_maximum)._val;
  operator<<(out,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeRange& shape) {
    out << "[" << shape.minimum() << ", " << shape.maximum() << "]";
    return out;
}